

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

void Abc_EnumerateCubeStatesZdd(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  abctime aVar8;
  Abc_ZddMan *p;
  abctime aVar9;
  long lVar10;
  abctime time;
  abctime time_00;
  abctime time_01;
  long lVar11;
  undefined4 *puVar12;
  char *pcVar13;
  bool bVar14;
  int pComb [9];
  int pPerm [24];
  
  aVar8 = Abc_Clock();
  puts("Enumerating states of 2x2x2 cube.");
  p = Abc_ZddManAlloc(0x114,0x8000000);
  Abc_ZddManCreatePerms(p,0x18);
  iVar3 = 1;
  pcVar13 = (char *)0x0;
  printf("Iter %2d -> %8d  Nodes = %7d  Used = %10d  ",0,1,0,2);
  aVar9 = Abc_Clock();
  iVar1 = (int)aVar8;
  Abc_PrintTime((int)aVar9 - iVar1,pcVar13,time);
  puVar12 = &DAT_00736924;
  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
    for (lVar10 = 0; lVar10 != 0x18; lVar10 = lVar10 + 1) {
      pPerm[lVar10] = (int)lVar10;
    }
    for (lVar10 = 0; lVar10 != 9; lVar10 = lVar10 + 1) {
      iVar2 = pPerm[(long)(int)puVar12[lVar10 * 2 + -1] + -1];
      iVar4 = puVar12[lVar10 * 2];
      pPerm[(long)(int)puVar12[lVar10 * 2 + -1] + -1] = pPerm[(long)iVar4 + -1];
      pPerm[(long)iVar4 + -1] = iVar2;
    }
    iVar2 = Abc_ZddPerm2Comb(pPerm,0x18,pComb);
    if (iVar2 != 9) {
      __assert_fail("nSize == 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilPerm.c"
                    ,0x36b,"void Abc_EnumerateCubeStatesZdd()");
    }
    for (lVar10 = 0; lVar10 != 9; lVar10 = lVar10 + 1) {
      iVar2 = Abc_ZddVarIJ(p,pComb[lVar10] >> 0x10,pComb[lVar10] & 0xffff);
      pComb[lVar10] = iVar2;
    }
    iVar2 = Abc_ZddBuildSet(p,pComb,9);
    iVar3 = Abc_ZddUnion(p,iVar3,iVar2);
    iVar4 = Abc_ZddPermProduct(p,iVar2,iVar2);
    iVar3 = Abc_ZddUnion(p,iVar3,iVar4);
    iVar2 = Abc_ZddPermProduct(p,iVar4,iVar2);
    iVar3 = Abc_ZddUnion(p,iVar3,iVar2);
    puVar12 = puVar12 + 0x12;
  }
  uVar5 = Abc_ZddCountPaths(p,iVar3);
  uVar6 = Abc_ZddCountNodes(p,iVar3);
  pcVar13 = (char *)0x1;
  printf("Iter %2d -> %8d  Nodes = %7d  Used = %10d  ",1,(ulong)uVar5,(ulong)uVar6,
         (ulong)(uint)p->nObjs);
  aVar8 = Abc_Clock();
  Abc_PrintTime((int)aVar8 - iVar1,pcVar13,time_00);
  uVar5 = 2;
  iVar2 = iVar3;
  do {
    if (uVar5 == 0x65) break;
    iVar4 = Abc_ZddPermProduct(p,iVar2,iVar3);
    uVar6 = Abc_ZddCountPaths(p,iVar4);
    uVar7 = Abc_ZddCountNodes(p,iVar4);
    pcVar13 = (char *)(ulong)uVar5;
    printf("Iter %2d -> %8d  Nodes = %7d  Used = %10d  ",pcVar13,(ulong)uVar6,(ulong)uVar7,
           (ulong)(uint)p->nObjs);
    aVar8 = Abc_Clock();
    Abc_PrintTime((int)aVar8 - iVar1,pcVar13,time_01);
    uVar5 = uVar5 + 1;
    bVar14 = iVar2 != iVar4;
    iVar2 = iVar4;
  } while (bVar14);
  Abc_ZddManFree(p);
  return;
}

Assistant:

void Abc_EnumerateCubeStatesZdd()
{
    int pXYZ[3][9][2] = {
        { {3, 5}, {3,17}, {3,15}, {1, 6}, {1,16}, {1,14}, {2, 4}, {2,18}, {2,13} },
        { {2,14}, {2,24}, {2,12}, {3,13}, {3,23}, {3,10}, {1,15}, {1,22}, {1,11} },
        { {1,10}, {1, 7}, {1, 4}, {3,12}, {3, 9}, {3, 6}, {2,11}, {2, 8}, {2, 5} }  };
#ifdef WIN32
    int LogObj = 24;
#else
    int LogObj = 27;
#endif
    Abc_ZddMan * p;
    int i, k, pComb[9], pPerm[24], nSize;
    int ZddTurn1, ZddTurn2, ZddTurn3, ZddTurns, ZddAll;
    abctime clk = Abc_Clock();
    printf( "Enumerating states of 2x2x2 cube.\n" );
    p = Abc_ZddManAlloc( 24 * 23 / 2, 1 << LogObj ); // finished with 2^27 (4 GB)
    Abc_ZddManCreatePerms( p, 24 );
    // init state
    printf( "Iter %2d -> %8d  Nodes = %7d  Used = %10d  ", 0, 1, 0, 2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // first 9 states
    ZddTurns = 1;
    for ( i = 0; i < 3; i++ )
    {
        for ( k = 0; k < 24; k++ )
            pPerm[k] = k;
        for ( k = 0; k < 9; k++ )
            ABC_SWAP( int, pPerm[pXYZ[i][k][0]-1], pPerm[pXYZ[i][k][1]-1] );
        nSize = Abc_ZddPerm2Comb( pPerm, 24, pComb );
        assert( nSize == 9 );
        for ( k = 0; k < 9; k++ )
            pComb[k] = Abc_ZddVarIJ( p, pComb[k] >> 16, pComb[k] & 0xffff );
        // add first turn
        ZddTurn1  = Abc_ZddBuildSet( p, pComb, 9 );
        ZddTurns = Abc_ZddUnion( p, ZddTurns, ZddTurn1 );
        //Abc_ZddPrint( p, ZddTurn1 );
        // add second turn
        ZddTurn2 = Abc_ZddPermProduct( p, ZddTurn1, ZddTurn1 );
        ZddTurns = Abc_ZddUnion( p, ZddTurns, ZddTurn2 );
        //Abc_ZddPrint( p, ZddTurn2 );
        // add third turn
        ZddTurn3 = Abc_ZddPermProduct( p, ZddTurn2, ZddTurn1 );
        ZddTurns = Abc_ZddUnion( p, ZddTurns, ZddTurn3 );
        //Abc_ZddPrint( p, ZddTurn3 );
        //printf( "\n" );
    }
    //Abc_ZddPrint( p, ZddTurns );
    printf( "Iter %2d -> %8d  Nodes = %7d  Used = %10d  ", 1, Abc_ZddCountPaths(p, ZddTurns), Abc_ZddCountNodes(p, ZddTurns), p->nObjs );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // other states
    ZddAll = ZddTurns;
    for ( i = 2; i <= 100; i++ )
    {
        int ZddAllPrev = ZddAll;
        ZddAll = Abc_ZddPermProduct( p, ZddAll, ZddTurns );
        printf( "Iter %2d -> %8d  Nodes = %7d  Used = %10d  ", i, Abc_ZddCountPaths(p, ZddAll), Abc_ZddCountNodes(p, ZddAll), p->nObjs );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        if ( ZddAllPrev == ZddAll )
            break;
    }
    Abc_ZddManFree( p );
}